

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  int iVar2;
  int in_EAX;
  entry *peVar3;
  ulong uVar4;
  long lVar5;
  uint i;
  ulong uVar6;
  uint i_1;
  ulong uVar7;
  ulong uVar8;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  val;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar6 = *(ulong *)ctx;
  uVar7 = 0xf;
  if ((long)uVar6 < 0) {
    uVar7 = (ulong)(uint)-(int)uVar6;
  }
  peVar3 = (entry *)operator_new__(uVar7 * 0x30);
  if ((int)uVar7 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&(peVar3->arg).type_ + lVar5) = 0;
      *(undefined4 *)((long)&(peVar3->arg).value_.field_0 + lVar5) = 0;
      puVar1 = (undefined8 *)((long)&(peVar3->name).data_ + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x30;
    } while (uVar7 * 0x30 - lVar5 != 0);
  }
  this->map_ = peVar3;
  uVar7 = 0;
  if ((uVar6 & 0xf00000000000000) != 0) {
    do {
      uVar4 = *(ulong *)(ctx + 8);
      iVar2 = *(int *)(uVar4 + 0x10 + uVar7 * 0x20);
      if (iVar2 == 1) {
        push_back(this,(value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                        )((anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
                           *)(uVar4 + uVar7 * 0x20))->string);
      }
      else if (iVar2 == 0) {
LAB_00135e07:
        return (int)uVar4;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while( true );
  }
  uVar8 = 0;
  do {
    uVar4 = (0xfL << ((byte)uVar7 & 0x3f) & uVar6) >> ((byte)uVar7 & 0x3f);
    if ((int)uVar4 == 1) {
      val.field_0.string.size = *(undefined8 *)(*(long *)(ctx + 8) + 8 + uVar8 * 0x10);
      val.field_0.long_long_value = *(undefined8 *)(*(long *)(ctx + 8) + uVar8 * 0x10);
      push_back(this,val);
      uVar6 = *(ulong *)ctx;
    }
    else if ((int)uVar4 == 0) goto LAB_00135e07;
    uVar8 = (ulong)((int)uVar8 + 1);
    uVar7 = (ulong)((int)uVar7 + 4);
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  bool use_values = args.type(max_packed_args - 1) == internal::none_type;
  if (use_values) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}